

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerType.cpp
# Opt level: O1

void __thiscall hdc::PointerType::~PointerType(PointerType *this)

{
  pointer pcVar1;
  
  (this->super_Type).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR_accept_00196960;
  if (this->subtype != (Type *)0x0) {
    (*(this->subtype->super_ASTNode)._vptr_ASTNode[2])();
  }
  pcVar1 = (this->token).lexem._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->token).lexem.field_2) {
    operator_delete(pcVar1);
  }
  Type::~Type(&this->super_Type);
  return;
}

Assistant:

PointerType::~PointerType() {
    if (subtype != nullptr) {
        delete subtype;
    }
}